

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O3

void ncnn::draw_text_c2(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uchar *resized_font_bitmap;
  size_t sVar9;
  uint uVar10;
  ulong uVar11;
  uchar *puVar12;
  uint uVar13;
  ulong uVar14;
  uchar *puVar15;
  long lVar16;
  
  iVar5 = fontpixelsize * 2;
  resized_font_bitmap = (uchar *)operator_new__((ulong)(uint)(iVar5 * fontpixelsize));
  sVar9 = strlen(text);
  if (0 < (int)(uint)sVar9) {
    uVar11 = 0;
    uVar8 = x;
    do {
      cVar1 = text[uVar11];
      if (cVar1 == ' ') {
        uVar7 = uVar8 + fontpixelsize;
      }
      else if (cVar1 == '\n') {
        y = y + iVar5;
        uVar7 = x;
      }
      else {
        iVar6 = isprint((int)cVar1);
        uVar7 = uVar8;
        if (iVar6 != 0) {
          resize_bilinear_font
                    ((uchar *)((long)cVar1 * 400 + 0x5a74c0),resized_font_bitmap,fontpixelsize);
          uVar13 = 0;
          if (0 < y) {
            uVar13 = y;
          }
          uVar3 = y + iVar5;
          if (h <= y + iVar5) {
            uVar3 = h;
          }
          uVar10 = 0;
          if (0 < (int)uVar8) {
            uVar10 = uVar8;
          }
          uVar7 = uVar8 + fontpixelsize;
          uVar4 = w;
          if ((int)uVar7 < w) {
            uVar4 = uVar7;
          }
          if ((int)uVar13 < (int)uVar3) {
            uVar14 = (ulong)uVar13;
            puVar12 = pixels + (long)stride * uVar14 + (ulong)(uVar10 * 2);
            puVar15 = resized_font_bitmap +
                      (((uVar14 - (long)y) * (long)fontpixelsize + (ulong)uVar10) - (long)(int)uVar8
                      );
            do {
              if ((int)uVar10 < (int)uVar4) {
                lVar16 = 0;
                do {
                  bVar2 = puVar15[lVar16];
                  uVar8 = bVar2 ^ 0xff;
                  puVar12[lVar16 * 2] =
                       (uchar)((ulong)((color & 0xff) * (uint)bVar2 + puVar12[lVar16 * 2] * uVar8) *
                               0x1010102 >> 0x20);
                  puVar12[lVar16 * 2 + 1] =
                       (uchar)((ulong)((uint)bVar2 * (color >> 8 & 0xff) +
                                      puVar12[lVar16 * 2 + 1] * uVar8) * 0x1010102 >> 0x20);
                  lVar16 = lVar16 + 1;
                } while (uVar4 - uVar10 != (int)lVar16);
              }
              uVar14 = uVar14 + 1;
              puVar12 = puVar12 + stride;
              puVar15 = puVar15 + fontpixelsize;
            } while (uVar14 != uVar3);
          }
        }
      }
      uVar8 = uVar7;
      uVar11 = uVar11 + 1;
    } while (uVar11 != ((uint)sVar9 & 0x7fffffff));
  }
  operator_delete__(resized_font_bitmap);
  return;
}

Assistant:

void draw_text_c2(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart * 2;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p[1] = (p[1] * (255 - alpha) + pen_color[1] * alpha) / 255;
                    p += 2;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}